

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_compute_forward_dup(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  ggml_type gVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  size_t __n;
  ulong uVar12;
  long lVar13;
  sbyte sVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ushort *puVar21;
  ulong uVar22;
  long lVar23;
  undefined2 *puVar24;
  size_t rs;
  long lVar25;
  ulong uVar26;
  size_t rs_1;
  size_t sVar27;
  undefined4 *puVar28;
  uint *puVar29;
  undefined1 auVar30 [16];
  long local_68;
  ulong local_58;
  
  switch(src0->type) {
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_I8:
  case GGML_TYPE_I16:
  case GGML_TYPE_I32:
  case GGML_TYPE_COUNT:
    ggml_compute_forward_dup_cold_1();
    goto LAB_0012db7d;
  case GGML_TYPE_F16:
    if (params->ith != 0) {
LAB_0012db87:
      ggml_compute_forward_dup_cold_7();
LAB_0012db8c:
      ggml_compute_forward_dup_cold_2();
LAB_0012db91:
      ggml_compute_forward_dup_cold_9();
LAB_0012db96:
      ggml_compute_forward_dup_cold_4();
      goto LAB_0012db9b;
    }
    gVar1 = dst->type;
    uVar18 = (ulong)gVar1;
    if (dst->nb[0] != GGML_TYPE_SIZE[uVar18]) {
LAB_0012db7d:
      ggml_compute_forward_dup_cold_8();
      goto LAB_0012db82;
    }
    if (dst->nb[1] != (dst->nb[0] * (long)dst->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[uVar18])
    goto LAB_0012db7d;
    if ((dst->nb[2] != dst->nb[1] * (long)dst->ne[1]) ||
       (dst->nb[3] != dst->nb[2] * (long)dst->ne[2])) goto LAB_0012db7d;
    iVar17 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
    uVar2 = src0->ne[0];
    uVar3 = src0->ne[1];
    iVar4 = src0->ne[2];
    lVar20 = (long)iVar4;
    uVar5 = src0->ne[3];
    uVar15 = (ulong)uVar5;
    if (iVar17 != uVar5 * iVar4 * uVar3 * uVar2) goto LAB_0012db91;
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    uVar12 = (ulong)uVar2;
    uVar19 = (ulong)uVar3;
    sVar6 = src0->nb[0];
    sVar27 = src0->nb[1];
    sVar7 = src0->nb[2];
    sVar8 = src0->nb[3];
    if (sVar6 != 2) {
      if (uVar18 == 5) {
        if ((int)uVar5 < 1) {
          return;
        }
        pvVar10 = dst->data;
        lVar13 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar4) {
            lVar23 = 0;
            lVar16 = lVar13;
            do {
              if (0 < (int)uVar3) {
                uVar22 = 0;
                lVar25 = lVar16;
                do {
                  if (0 < (int)uVar2) {
                    puVar24 = (undefined2 *)((long)src0->data + lVar25);
                    uVar26 = 0;
                    do {
                      *(undefined2 *)((long)pvVar10 + uVar26 * 2 + (long)iVar17 * 2) = *puVar24;
                      uVar26 = uVar26 + 1;
                      puVar24 = (undefined2 *)((long)puVar24 + sVar6);
                    } while (uVar12 != uVar26);
                    iVar17 = iVar17 + (int)uVar26;
                  }
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + sVar27;
                } while (uVar22 != uVar19);
              }
              lVar23 = lVar23 + 1;
              lVar16 = lVar16 + sVar7;
            } while (lVar23 != lVar20);
          }
          uVar18 = uVar18 + 1;
          lVar13 = lVar13 + sVar8;
        } while (uVar18 != uVar15);
        return;
      }
      if (gVar1 == GGML_TYPE_F32) {
        if (0 < (int)uVar5) {
          pvVar10 = dst->data;
          lVar13 = 0;
          uVar18 = 0;
          iVar17 = 0;
          do {
            if (0 < iVar4) {
              lVar23 = 0;
              lVar16 = lVar13;
              do {
                if (0 < (int)uVar3) {
                  uVar22 = 0;
                  lVar25 = lVar16;
                  do {
                    if (0 < (int)uVar2) {
                      puVar21 = (ushort *)((long)src0->data + lVar25);
                      uVar26 = 0;
                      do {
                        *(float *)((long)pvVar10 + uVar26 * 4 + (long)iVar17 * 4) =
                             table_f32_f16[*puVar21];
                        uVar26 = uVar26 + 1;
                        puVar21 = (ushort *)((long)puVar21 + sVar6);
                      } while (uVar12 != uVar26);
                      iVar17 = iVar17 + (int)uVar26;
                    }
                    uVar22 = uVar22 + 1;
                    lVar25 = lVar25 + sVar27;
                  } while (uVar22 != uVar19);
                }
                lVar23 = lVar23 + 1;
                lVar16 = lVar16 + sVar7;
              } while (lVar23 != lVar20);
            }
            uVar18 = uVar18 + 1;
            lVar13 = lVar13 + sVar8;
          } while (uVar18 != uVar15);
          return;
        }
        return;
      }
      goto LAB_0012dba0;
    }
    __n = (long)(int)uVar2 * 2;
    if (((gVar1 == GGML_TYPE_F16) && (sVar27 == __n)) &&
       ((sVar7 == sVar27 * (long)(int)uVar3 && (sVar14 = 1, sVar8 == sVar7 * lVar20)))) {
LAB_0012d68f:
      memcpy(dst->data,src0->data,(long)iVar17 << sVar14);
      return;
    }
    if (uVar18 == 6) {
      if (0 < (int)uVar5) {
        pvVar10 = dst->data;
        lVar13 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar4) {
            lVar23 = 0;
            lVar16 = lVar13;
            do {
              if (0 < (int)uVar3) {
                uVar22 = 0;
                lVar25 = lVar16;
                do {
                  if (0 < (int)uVar2) {
                    pvVar11 = src0->data;
                    uVar26 = 0;
                    do {
                      *(float *)((long)pvVar10 + uVar26 * 4 + (long)iVar17 * 4) =
                           table_f32_f16[*(ushort *)((long)pvVar11 + uVar26 * 2 + lVar25)];
                      uVar26 = uVar26 + 1;
                    } while (uVar12 != uVar26);
                    iVar17 = iVar17 + (int)uVar26;
                  }
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + sVar27;
                } while (uVar22 != uVar19);
              }
              lVar23 = lVar23 + 1;
              lVar16 = lVar16 + sVar7;
            } while (lVar23 != lVar20);
          }
          uVar18 = uVar18 + 1;
          lVar13 = lVar13 + sVar8;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
    if (gVar1 == GGML_TYPE_F16) {
      if (0 < (int)uVar5) {
        local_68 = 0;
        local_58 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar4) {
            lVar16 = 0;
            lVar13 = local_68;
            do {
              if (0 < (int)uVar3) {
                lVar25 = __n * (long)iVar17;
                iVar17 = iVar17 + uVar3;
                uVar18 = uVar19;
                lVar23 = lVar13;
                do {
                  memcpy((void *)((long)dst->data + lVar25),(void *)((long)src0->data + lVar23),__n)
                  ;
                  lVar23 = lVar23 + sVar27;
                  lVar25 = lVar25 + __n;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              lVar16 = lVar16 + 1;
              lVar13 = lVar13 + sVar7;
            } while (lVar16 != lVar20);
          }
          local_58 = local_58 + 1;
          local_68 = local_68 + sVar8;
        } while (local_58 != uVar15);
        return;
      }
      return;
    }
    break;
  case GGML_TYPE_F32:
    if (params->ith != 0) goto LAB_0012db8c;
    gVar1 = dst->type;
    uVar18 = (ulong)gVar1;
    if (dst->nb[0] != GGML_TYPE_SIZE[uVar18]) {
LAB_0012db82:
      ggml_compute_forward_dup_cold_3();
      goto LAB_0012db87;
    }
    if (dst->nb[1] != (dst->nb[0] * (long)dst->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[uVar18])
    goto LAB_0012db82;
    if ((dst->nb[2] != dst->nb[1] * (long)dst->ne[1]) ||
       (dst->nb[3] != dst->nb[2] * (long)dst->ne[2])) goto LAB_0012db82;
    iVar17 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
    uVar2 = src0->ne[0];
    uVar3 = src0->ne[1];
    iVar4 = src0->ne[2];
    lVar20 = (long)iVar4;
    uVar5 = src0->ne[3];
    uVar15 = (ulong)uVar5;
    if (iVar17 != uVar5 * iVar4 * uVar3 * uVar2) goto LAB_0012db96;
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    uVar12 = (ulong)uVar2;
    uVar19 = (ulong)uVar3;
    sVar6 = src0->nb[0];
    sVar7 = src0->nb[1];
    sVar8 = src0->nb[2];
    sVar9 = src0->nb[3];
    if (sVar6 == 4) {
      sVar27 = (long)(int)uVar2 * 4;
      if ((((gVar1 == GGML_TYPE_F32) && (sVar7 == sVar27)) && (sVar8 == sVar7 * (long)(int)uVar3))
         && (sVar14 = 2, sVar9 == sVar8 * lVar20)) goto LAB_0012d68f;
      if (uVar18 == 5) {
        if (0 < (int)uVar5) {
          lVar13 = 0;
          uVar18 = 0;
          do {
            if (0 < iVar4) {
              lVar23 = 0;
              lVar16 = lVar13;
              do {
                if (0 < (int)uVar3) {
                  uVar22 = 0;
                  lVar25 = lVar16;
                  do {
                    if (0 < (int)uVar2) {
                      uVar26 = 0;
                      do {
                        auVar30 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)src0->data +
                                                                  uVar26 * 4 + lVar25)),0);
                        vpextrw_avx(auVar30,0);
                        uVar26 = uVar26 + 1;
                      } while (uVar12 != uVar26);
                    }
                    uVar22 = uVar22 + 1;
                    lVar25 = lVar25 + sVar7;
                  } while (uVar22 != uVar19);
                }
                lVar23 = lVar23 + 1;
                lVar16 = lVar16 + sVar8;
              } while (lVar23 != lVar20);
            }
            uVar18 = uVar18 + 1;
            lVar13 = lVar13 + sVar9;
          } while (uVar18 != uVar15);
          return;
        }
        return;
      }
      if (gVar1 == GGML_TYPE_F32) {
        if (0 < (int)uVar5) {
          local_68 = 0;
          local_58 = 0;
          iVar17 = 0;
          do {
            if (0 < iVar4) {
              lVar16 = 0;
              lVar13 = local_68;
              do {
                if (0 < (int)uVar3) {
                  lVar25 = sVar27 * (long)iVar17;
                  iVar17 = iVar17 + uVar3;
                  uVar18 = uVar19;
                  lVar23 = lVar13;
                  do {
                    memcpy((void *)((long)dst->data + lVar25),(void *)((long)src0->data + lVar23),
                           sVar27);
                    lVar23 = lVar23 + sVar7;
                    lVar25 = lVar25 + sVar27;
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                lVar16 = lVar16 + 1;
                lVar13 = lVar13 + sVar8;
              } while (lVar16 != lVar20);
            }
            local_58 = local_58 + 1;
            local_68 = local_68 + sVar9;
          } while (local_58 != uVar15);
          return;
        }
        return;
      }
      goto LAB_0012dbaa;
    }
    if (uVar18 == 5) {
      if (0 < (int)uVar5) {
        lVar13 = 0;
        uVar18 = 0;
        do {
          if (0 < iVar4) {
            lVar23 = 0;
            lVar16 = lVar13;
            do {
              if (0 < (int)uVar3) {
                uVar22 = 0;
                lVar25 = lVar16;
                do {
                  if (0 < (int)uVar2) {
                    puVar29 = (uint *)((long)src0->data + lVar25);
                    uVar26 = 0;
                    do {
                      auVar30 = vcvtps2ph_f16c(ZEXT416(*puVar29),0);
                      vpextrw_avx(auVar30,0);
                      uVar26 = uVar26 + 1;
                      puVar29 = (uint *)((long)puVar29 + sVar6);
                    } while (uVar12 != uVar26);
                  }
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + sVar7;
                } while (uVar22 != uVar19);
              }
              lVar23 = lVar23 + 1;
              lVar16 = lVar16 + sVar8;
            } while (lVar23 != lVar20);
          }
          uVar18 = uVar18 + 1;
          lVar13 = lVar13 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
    if (gVar1 == GGML_TYPE_F32) {
      if (0 < (int)uVar5) {
        pvVar10 = dst->data;
        lVar13 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar4) {
            lVar23 = 0;
            lVar16 = lVar13;
            do {
              if (0 < (int)uVar3) {
                uVar22 = 0;
                lVar25 = lVar16;
                do {
                  if (0 < (int)uVar2) {
                    puVar28 = (undefined4 *)((long)src0->data + lVar25);
                    uVar26 = 0;
                    do {
                      *(undefined4 *)((long)pvVar10 + uVar26 * 4 + (long)iVar17 * 4) = *puVar28;
                      uVar26 = uVar26 + 1;
                      puVar28 = (undefined4 *)((long)puVar28 + sVar6);
                    } while (uVar12 != uVar26);
                    iVar17 = iVar17 + (int)uVar26;
                  }
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + sVar7;
                } while (uVar22 != uVar19);
              }
              lVar23 = lVar23 + 1;
              lVar16 = lVar16 + sVar8;
            } while (lVar23 != lVar20);
          }
          uVar18 = uVar18 + 1;
          lVar13 = lVar13 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
LAB_0012db9b:
    ggml_compute_forward_dup_cold_5();
LAB_0012dba0:
    ggml_compute_forward_dup_cold_10();
    break;
  default:
    return;
  }
  ggml_compute_forward_dup_cold_11();
LAB_0012dbaa:
  ggml_compute_forward_dup_cold_6();
}

Assistant:

static void ggml_compute_forward_dup(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_dup_f16(params, src0, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_dup_f32(params, src0, dst);
            } break;
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}